

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL UnlockFile(HANDLE hFile,DWORD dwFileOffsetLow,DWORD dwFileOffsetHigh,
               DWORD nNumberOfBytesToUnlockLow,DWORD nNumberOfBytesToUnlockHigh)

{
  PAL_ERROR dwLastError;
  CPalThread *pThread_00;
  PAL_ERROR palError;
  CPalThread *pThread;
  DWORD nNumberOfBytesToUnlockHigh_local;
  DWORD nNumberOfBytesToUnlockLow_local;
  DWORD dwFileOffsetHigh_local;
  DWORD dwFileOffsetLow_local;
  HANDLE hFile_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalUnlockFile
                          (pThread_00,hFile,dwFileOffsetLow,dwFileOffsetHigh,
                           nNumberOfBytesToUnlockLow,nNumberOfBytesToUnlockHigh);
  if (dwLastError != 0) {
    CorUnix::CPalThread::SetLastError(dwLastError);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)(dwLastError == 0);
}

Assistant:

PALIMPORT
BOOL
PALAPI
UnlockFile(HANDLE hFile,
           DWORD dwFileOffsetLow,
           DWORD dwFileOffsetHigh,
           DWORD nNumberOfBytesToUnlockLow,
           DWORD nNumberOfBytesToUnlockHigh)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;

    PERF_ENTRY(UnlockFile);
    ENTRY("UnlockFile(hFile:%p, offsetLow:%u, offsetHigh:%u, nbBytesLow:%u,"
          "nbBytesHigh:%u\n", hFile, dwFileOffsetLow, dwFileOffsetHigh, 
          nNumberOfBytesToUnlockLow, nNumberOfBytesToUnlockHigh);

    pThread = InternalGetCurrentThread();

    palError = InternalUnlockFile(
        pThread,
        hFile,
        dwFileOffsetLow,
        dwFileOffsetHigh,
        nNumberOfBytesToUnlockLow,
        nNumberOfBytesToUnlockHigh
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("UnlockFile returns %s\n", NO_ERROR == palError ? "TRUE" : "FALSE");
    PERF_EXIT(UnlockFile);
    return NO_ERROR == palError;
}